

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::StartGroup(XmlReporter *this,string *groupName)

{
  XmlWriter *this_00;
  XmlWriter *name;
  long in_RDI;
  string *in_stack_ffffffffffffff68;
  XmlWriter *in_stack_ffffffffffffff70;
  allocator *attribute;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  this_00 = (XmlWriter *)(in_RDI + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Group",&local_31);
  name = XmlWriter::startElement(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  attribute = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"name",attribute);
  XmlWriter::writeAttribute(this_00,(string *)name,(string *)attribute);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

virtual void StartGroup( const std::string& groupName ) {
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupName );
        }